

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O3

int tclpkcs11_start_session(tclpkcs11_handle *handle,CK_SLOT_ID slot)

{
  CK_SESSION_HANDLE in_RAX;
  CK_RV CVar1;
  CK_RV CVar2;
  CK_SESSION_HANDLE tmp_session;
  CK_SESSION_HANDLE local_28;
  
  local_28 = in_RAX;
  if (handle->session_active != 0) {
    CVar1 = 0;
    if (handle->session_slot == slot) goto LAB_00109912;
    handle->session_active = 0;
    CVar1 = (*handle->pkcs11->C_CloseSession)(handle->session);
    if (CVar1 != 0) goto LAB_00109912;
  }
  CVar1 = 0;
  CVar2 = (*handle->pkcs11->C_OpenSession)(slot,6,(CK_VOID_PTR)0x0,(CK_NOTIFY)0x0,&local_28);
  if (CVar2 == 0) {
    handle->session = local_28;
    handle->session_slot = slot;
    handle->session_active = 1;
  }
  else {
    (*handle->pkcs11->C_CloseSession)(handle->session);
    CVar1 = CVar2 & 0xffffffff;
  }
LAB_00109912:
  return (int)CVar1;
}

Assistant:

MODULE_SCOPE int tclpkcs11_start_session(struct tclpkcs11_handle *handle, CK_SLOT_ID slot) {
  CK_SESSION_HANDLE tmp_session;
  CK_RV chk_rv;

  if (handle->session_active) {
    if (handle->session_slot == slot) {
      return(CKR_OK);
    }

    /* Close the existing session and create a new one */
    handle->session_active = 0;
    chk_rv = handle->pkcs11->C_CloseSession(handle->session);
    if (chk_rv != CKR_OK) {
      return(chk_rv);
    }
  }

  /*LISSI*/
  /*	chk_rv = handle->pkcs11->C_OpenSession(slot, CKF_SERIAL_SESSION, NULL, NULL, &tmp_session);*/
  chk_rv = handle->pkcs11->C_OpenSession(slot, CKF_RW_SESSION | CKF_SERIAL_SESSION, NULL, NULL, &tmp_session);

  if (chk_rv != CKR_OK) {
    handle->pkcs11->C_CloseSession(handle->session);

    return(chk_rv);
  }

  handle->session = tmp_session;
  handle->session_slot = slot;
  handle->session_active = 1;

  return(CKR_OK);
}